

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error.c
# Opt level: O1

int run_test_tcp_connect_error_fault(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  char garbage [60];
  uv_tcp_t server;
  uv_connect_t req;
  sockaddr local_1a8;
  char local_198 [56];
  uv_tcp_t local_160;
  
  builtin_strncpy(local_198 + 0x20,"h blah blah",0xc);
  builtin_strncpy(local_198 + 0x10,"ah blah blah bla",0x10);
  builtin_strncpy(local_198,"lah blah blah bl",0x10);
  local_1a8._0_8_ = 0x616c622068616c62;
  builtin_strncpy(local_1a8.sa_data + 6,"h blah b",8);
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&local_160);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)&stack0xffffffffffffff98;
    iVar1 = uv_tcp_connect((uv_connect_t *)puVar2,&local_160,&local_1a8,connect_cb);
    if (iVar1 != -0x16) goto LAB_0017cc4d;
    uv_close((uv_handle_t *)&local_160,close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (connect_cb_called != 0) goto LAB_0017cc52;
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017cc5c;
    }
  }
  else {
    run_test_tcp_connect_error_fault_cold_1();
LAB_0017cc4d:
    run_test_tcp_connect_error_fault_cold_2();
LAB_0017cc52:
    run_test_tcp_connect_error_fault_cold_3();
  }
  run_test_tcp_connect_error_fault_cold_4();
LAB_0017cc5c:
  run_test_tcp_connect_error_fault_cold_5();
  if (puVar2 != (uv_loop_t *)0x0) {
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX;
  }
  connect_cb_cold_1();
  if (puVar2 != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(tcp_connect_error_fault) {
  const char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  const struct sockaddr_in* garbage_addr;
  uv_tcp_t server;
  int r;
  uv_connect_t req;

  garbage_addr = (const struct sockaddr_in*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_connect(&req,
                     &server,
                     (const struct sockaddr*) garbage_addr,
                     connect_cb);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_called == 0);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}